

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O1

int luaopen_sproto_core(lua_State *L)

{
  luaL_Reg l [10];
  luaL_Reg alStack_b8 [10];
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(alStack_b8,&PTR_anon_var_dwarf_2579b_00162e40,0xa0);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,9);
  luaL_setfuncs(L,alStack_b8,0);
  pushfunction_withbuffer(L,"encode",lencode);
  pushfunction_withbuffer(L,"pack",lpack);
  pushfunction_withbuffer(L,"unpack",lunpack);
  return 1;
}

Assistant:

int
luaopen_sproto_core(lua_State *L) {
#ifdef luaL_checkversion
	luaL_checkversion(L);
#endif
	luaL_Reg l[] = {
		{ "newproto", lnewproto },
		{ "deleteproto", ldeleteproto },
		{ "dumpproto", ldumpproto },
		{ "querytype", lquerytype },
		{ "decode", ldecode },
		{ "protocol", lprotocol },
		{ "loadproto", lloadproto },
		{ "saveproto", lsaveproto },
		{ "default", ldefault },
		{ NULL, NULL },
	};
	luaL_newlib(L,l);
	pushfunction_withbuffer(L, "encode", lencode);
	pushfunction_withbuffer(L, "pack", lpack);
	pushfunction_withbuffer(L, "unpack", lunpack);
	return 1;
}